

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O2

long sd_line(int child,long skip_count)

{
  int nStream;
  int iVar1;
  
  for (iVar1 = 0; iVar1 != 7; iVar1 = iVar1 + 1) {
    for (nStream = 0xe; nStream != 0x19; nStream = nStream + 1) {
      advanceStream(nStream,skip_count,0);
    }
    advanceStream(0x19,skip_count * 2,0);
  }
  if (child == 1) {
    advanceStream(0xd,skip_count,0);
    advanceStream(0x2b,skip_count,0);
  }
  return 0;
}

Assistant:

long 
sd_line(int child, DSS_HUGE skip_count)
	{
	int i,j;
	
	for (j=0; j < O_LCNT_MAX; j++)
	{
		for (i=L_QTY_SD; i<= L_RFLG_SD; i++)
/*
			if (scale >= 30000 && i == L_PKEY_SD)
				ADVANCE_STREAM64(i, skip_count);
			else
*/
				ADVANCE_STREAM(i, skip_count);
		ADVANCE_STREAM(L_CMNT_SD, skip_count * 2);
	}
	
	/* need to special case this as the link between master and detail */
	if (child == 1)
	{
		ADVANCE_STREAM(O_ODATE_SD, skip_count);
		ADVANCE_STREAM(O_LCNT_SD, skip_count);
	}
	
	return(0L);
	}